

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint pi;
  int iVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char test [64];
  char local_78 [72];
  
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  if (argc < 2) {
    sVar5 = strlen(local_78);
    builtin_strncpy(local_78 + sVar5,"0123456789",0xb);
  }
  else {
    pcVar6 = argv[1];
    if (*pcVar6 != '\0') {
      uVar7 = 0;
      pp_Var2 = __ctype_tolower_loc();
      lVar8 = 0;
      do {
        iVar1 = (*pp_Var2)[pcVar6[uVar7]];
        pcVar3 = strchr(local_78,iVar1);
        if (pcVar3 == (char *)0x0) {
          lVar4 = (long)(int)lVar8;
          lVar8 = lVar4 + 1;
          local_78[lVar4] = (char)iVar1;
          local_78[lVar4 + 1] = '\0';
        }
        uVar7 = uVar7 + 1;
        sVar5 = strlen(pcVar6);
      } while (uVar7 < sVar5);
    }
  }
  pi = pigpio_start(0,0);
  uVar7 = (ulong)pi;
  if ((int)pi < 0) {
    fprintf(_stderr,"pigpio initialisation failed (%d).\n",uVar7);
    iVar1 = 1;
  }
  else {
    printf("Connected to pigpio daemon (%d).\n",uVar7);
    pcVar6 = strchr(local_78,0x30);
    if (pcVar6 != (char *)0x0) {
      t0(pi);
    }
    pcVar6 = strchr(local_78,0x31);
    if (pcVar6 != (char *)0x0) {
      t1(pi);
    }
    pcVar6 = strchr(local_78,0x32);
    if (pcVar6 != (char *)0x0) {
      t2(pi);
    }
    pcVar6 = strchr(local_78,0x33);
    if (pcVar6 != (char *)0x0) {
      t3(pi);
    }
    pcVar6 = strchr(local_78,0x34);
    if (pcVar6 != (char *)0x0) {
      t4(pi);
    }
    pcVar6 = strchr(local_78,0x35);
    if (pcVar6 != (char *)0x0) {
      t5(pi);
    }
    pcVar6 = strchr(local_78,0x36);
    if (pcVar6 != (char *)0x0) {
      t6(pi);
    }
    pcVar6 = strchr(local_78,0x37);
    if (pcVar6 != (char *)0x0) {
      t7(pi);
    }
    pcVar6 = strchr(local_78,0x38);
    if (pcVar6 != (char *)0x0) {
      t8(pi);
    }
    pcVar6 = strchr(local_78,0x39);
    if (pcVar6 != (char *)0x0) {
      t9(pi);
    }
    pcVar6 = strchr(local_78,0x61);
    if (pcVar6 != (char *)0x0) {
      ta(pi);
    }
    pcVar6 = strchr(local_78,0x62);
    if (pcVar6 != (char *)0x0) {
      tb(pi);
    }
    pcVar6 = strchr(local_78,99);
    if (pcVar6 != (char *)0x0) {
      tc(pi);
    }
    pigpio_stop(uVar7);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
   int i, t, c, pi;

   char test[64]={0,};

   if (argc > 1)
   {
      t = 0;

      for (i=0; i<strlen(argv[1]); i++)
      {
         c = tolower(argv[1][i]);

         if (!strchr(test, c))
         {
            test[t++] = c;
            test[t] = 0;
         }
      }
   }
   else strcat(test, "0123456789");

   pi = pigpio_start(0, 0);

   if (pi < 0)
   {
      fprintf(stderr, "pigpio initialisation failed (%d).\n", pi);
      return 1;
   }

   printf("Connected to pigpio daemon (%d).\n", pi);

   if (strchr(test, '0')) t0(pi);
   if (strchr(test, '1')) t1(pi);
   if (strchr(test, '2')) t2(pi);
   if (strchr(test, '3')) t3(pi);
   if (strchr(test, '4')) t4(pi);
   if (strchr(test, '5')) t5(pi);
   if (strchr(test, '6')) t6(pi);
   if (strchr(test, '7')) t7(pi);
   if (strchr(test, '8')) t8(pi);
   if (strchr(test, '9')) t9(pi);
   if (strchr(test, 'a')) ta(pi);
   if (strchr(test, 'b')) tb(pi);
   if (strchr(test, 'c')) tc(pi);

   pigpio_stop(pi);

   return 0;
}